

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypeEmbeddedFontWriter.cpp
# Opt level: O3

bool __thiscall
TrueTypeEmbeddedFontWriter::AddComponentGlyphs
          (TrueTypeEmbeddedFontWriter *this,uint inGlyphID,UIntSet *ioComponents)

{
  GlyphEntry *pGVar1;
  _List_node_base *p_Var2;
  Trace *this_00;
  bool bVar3;
  
  if (inGlyphID < (this->mTrueTypeInput).mMaxp.NumGlyphs) {
    pGVar1 = (this->mTrueTypeInput).mGlyf[inGlyphID];
    if ((pGVar1 == (GlyphEntry *)0x0) ||
       ((pGVar1->mComponentGlyphs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl._M_node._M_size == 0)) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
      for (p_Var2 = (pGVar1->mComponentGlyphs).
                    super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
                    super__List_node_base._M_next;
          p_Var2 != (_List_node_base *)&pGVar1->mComponentGlyphs; p_Var2 = p_Var2->_M_next) {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)ioComponents,(uint *)(p_Var2 + 1));
        AddComponentGlyphs(this,*(uint *)&p_Var2[1]._M_next,ioComponents);
      }
    }
  }
  else {
    this_00 = Trace::DefaultTrace();
    bVar3 = false;
    Trace::TraceToLog(this_00,
                      "TrueTypeEmbeddedFontWriter::AddComponentGlyphs, error, requested glyph index %ld is larger than the maximum glyph index for this font which is %ld. "
                      ,(ulong)inGlyphID,(ulong)((this->mTrueTypeInput).mMaxp.NumGlyphs - 1));
  }
  return bVar3;
}

Assistant:

bool TrueTypeEmbeddedFontWriter::AddComponentGlyphs(unsigned int inGlyphID,UIntSet& ioComponents)
{
	GlyphEntry* glyfTableEntry;
	UIntList::iterator itComponentGlyphs;
	bool isComposite = false;

	if(inGlyphID >= mTrueTypeInput.mMaxp.NumGlyphs)
	{
		TRACE_LOG2("TrueTypeEmbeddedFontWriter::AddComponentGlyphs, error, requested glyph index %ld is larger than the maximum glyph index for this font which is %ld. ",inGlyphID,mTrueTypeInput.mMaxp.NumGlyphs-1);
		return false;
	}

	glyfTableEntry = mTrueTypeInput.mGlyf[inGlyphID];
	if(glyfTableEntry != NULL && glyfTableEntry->mComponentGlyphs.size() > 0)
	{
		isComposite = true;
		for(itComponentGlyphs = glyfTableEntry->mComponentGlyphs.begin(); 
				itComponentGlyphs != glyfTableEntry->mComponentGlyphs.end(); 
				++itComponentGlyphs)
		{
				ioComponents.insert(*itComponentGlyphs);
				AddComponentGlyphs(*itComponentGlyphs,ioComponents);
		}
	}
	return isComposite;
}